

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIAggregator.cpp
# Opt level: O0

void __thiscall
adios2::aggregator::MPIAggregator::InitComm(MPIAggregator *this,size_t subStreams,Comm *parentComm)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Comm *in_RDX;
  ulong uVar6;
  ulong in_RSI;
  long in_RDI;
  size_t firstInSmallGroups;
  size_t r;
  size_t q;
  size_t processes;
  size_t process;
  int parentSize;
  int parentRank;
  undefined4 uVar7;
  string *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  Comm *in_stack_ffffffffffffff98;
  
  iVar1 = helper::Comm::Rank((Comm *)0xd70209);
  iVar2 = helper::Comm::Size((Comm *)0xd7021d);
  uVar3 = (ulong)iVar1;
  uVar4 = (ulong)(long)iVar2 / in_RSI;
  uVar6 = (ulong)(long)iVar2 % in_RSI;
  uVar5 = uVar6 * (uVar4 + 1);
  if (uVar3 < uVar5) {
    *(ulong *)(in_RDI + 0x10) = uVar3 / (uVar4 + 1);
    *(int *)(in_RDI + 0x34) = (int)*(undefined8 *)(in_RDI + 0x10) * ((int)uVar4 + 1);
  }
  else {
    *(ulong *)(in_RDI + 0x10) = uVar6 + (uVar3 - uVar5) / uVar4;
    *(int *)(in_RDI + 0x34) =
         (int)uVar5 + ((int)*(undefined8 *)(in_RDI + 0x10) - (int)uVar6) * (int)uVar4;
  }
  uVar7 = *(undefined4 *)(in_RDI + 0x34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff90,"creating aggregators comm with split at Open",
             (allocator *)&stack0xffffffffffffff8f);
  helper::Comm::Split(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                      in_stack_ffffffffffffff88);
  helper::Comm::operator=((Comm *)CONCAT44(iVar1,uVar7),in_RDX);
  helper::Comm::~Comm((Comm *)0xd70393);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  iVar1 = helper::Comm::Rank((Comm *)0xd703b5);
  *(int *)(in_RDI + 0x28) = iVar1;
  iVar1 = helper::Comm::Size((Comm *)0xd703c6);
  *(int *)(in_RDI + 0x2c) = iVar1;
  if (*(int *)(in_RDI + 0x28) != 0) {
    *(undefined1 *)(in_RDI + 0x30) = 0;
  }
  *(undefined1 *)(in_RDI + 0x31) = 1;
  *(ulong *)(in_RDI + 8) = in_RSI;
  return;
}

Assistant:

void MPIAggregator::InitComm(const size_t subStreams, helper::Comm const &parentComm)
{
    int parentRank = parentComm.Rank();
    int parentSize = parentComm.Size();

    const size_t process = static_cast<size_t>(parentRank);
    const size_t processes = static_cast<size_t>(parentSize);

    // Divide the processes into S=subStreams groups.
    const size_t q = processes / subStreams;
    const size_t r = processes % subStreams;

    // Groups [0,r) have size q+1.  Groups [r,S) have size q.
    const size_t firstInSmallGroups = r * (q + 1);

    // Within each group the first process becomes its consumer.
    if (process >= firstInSmallGroups)
    {
        m_SubStreamIndex = r + (process - firstInSmallGroups) / q;
        m_AggregatorRank = static_cast<int>(firstInSmallGroups + (m_SubStreamIndex - r) * q);
    }
    else
    {
        m_SubStreamIndex = process / (q + 1);
        m_AggregatorRank = static_cast<int>(m_SubStreamIndex * (q + 1));
    }

    m_Comm = parentComm.Split(m_AggregatorRank, parentRank,
                              "creating aggregators comm with split at Open");

    m_Rank = m_Comm.Rank();
    m_Size = m_Comm.Size();

    if (m_Rank != 0)
    {
        m_IsAggregator = false;
    }

    m_IsActive = true;
    m_SubStreams = subStreams;
}